

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExportBuildAndroidMKGenerator.cxx
# Opt level: O3

void __thiscall
cmExportBuildAndroidMKGenerator::GenerateImportTargetCode
          (cmExportBuildAndroidMKGenerator *this,ostream *os,cmGeneratorTarget *target,
          TargetType param_3)

{
  pointer pcVar1;
  pointer pcVar2;
  ostream *poVar3;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  string path;
  string targetName;
  string noConfig;
  string local_a8;
  string local_88;
  string local_68;
  string local_48;
  
  pcVar1 = (this->super_cmExportBuildFileGenerator).super_cmExportFileGenerator.Namespace.
           _M_dataplus._M_p;
  pcVar2 = (pointer)(this->super_cmExportBuildFileGenerator).super_cmExportFileGenerator.Namespace.
                    _M_string_length;
  cmGeneratorTarget::GetExportName_abi_cxx11_(&local_a8,target);
  local_68.field_2._M_allocated_capacity = local_a8._M_string_length;
  local_68.field_2._8_8_ = local_a8._M_dataplus._M_p;
  views._M_len = 2;
  views._M_array = (iterator)&local_68;
  local_68._M_dataplus._M_p = pcVar2;
  local_68._M_string_length = (size_type)pcVar1;
  cmCatViews_abi_cxx11_(&local_88,views);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
    operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
  }
  std::__ostream_insert<char,std::char_traits<char>>(os,"include $(CLEAR_VARS)\n",0x16);
  std::__ostream_insert<char,std::char_traits<char>>(os,"LOCAL_MODULE := ",0x10);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     (os,local_88._M_dataplus._M_p,local_88._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>(os,"LOCAL_SRC_FILES := ",0x13);
  local_68._M_string_length = 0;
  local_68.field_2._M_allocated_capacity =
       local_68.field_2._M_allocated_capacity & 0xffffffffffffff00;
  local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
  cmGeneratorTarget::GetFullPath(&local_48,target,&local_68,RuntimeBinaryArtifact,false);
  cmSystemTools::ConvertToOutputPath(&local_a8,&local_48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     (os,local_a8._M_dataplus._M_p,local_a8._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
    operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != &local_88.field_2) {
    operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void cmExportBuildAndroidMKGenerator::GenerateImportTargetCode(
  std::ostream& os, cmGeneratorTarget const* target,
  cmStateEnums::TargetType /*targetType*/)
{
  std::string targetName = cmStrCat(this->Namespace, target->GetExportName());
  os << "include $(CLEAR_VARS)\n";
  os << "LOCAL_MODULE := ";
  os << targetName << "\n";
  os << "LOCAL_SRC_FILES := ";
  std::string const noConfig; // FIXME: What config to use here?
  std::string path =
    cmSystemTools::ConvertToOutputPath(target->GetFullPath(noConfig));
  os << path << "\n";
}